

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O0

int write_misa(CPURISCVState_conflict2 *env,int csrno,target_ulong val)

{
  _Bool _Var1;
  ulong uVar2;
  CPUState *cpu;
  ulong unaff_retaddr;
  ulong local_28;
  target_ulong val_local;
  int csrno_local;
  CPURISCVState_conflict2 *env_local;
  
  _Var1 = riscv_feature(env,2);
  if (((_Var1) && ((val & 0x110) != 0)) && ((val & 0x10) == 0)) {
    uVar2 = env->misa_mask & val;
    local_28 = uVar2 & 0x14113d;
    if (((uVar2 & 8) != 0) && ((uVar2 & 0x20) == 0)) {
      local_28 = uVar2 & 0x141135;
    }
    if (((local_28 & 4) != 0) && ((unaff_retaddr & 0xfffffffffffffffc) != 0)) {
      local_28 = local_28 & 0xfffffffffffffffb;
    }
    local_28 = env->misa & 0xc000000000000000 | local_28;
    if (local_28 != env->misa) {
      cpu = env_cpu(env);
      tb_flush_riscv64(cpu);
    }
    env->misa = local_28;
  }
  return 0;
}

Assistant:

static int write_misa(CPURISCVState *env, int csrno, target_ulong val)
{
    if (!riscv_feature(env, RISCV_FEATURE_MISA)) {
        /* drop write to misa */
        return 0;
    }

    /* 'I' or 'E' must be present */
    if (!(val & (RVI | RVE))) {
        /* It is not, drop write to misa */
        return 0;
    }

    /* 'E' excludes all other extensions */
    if (val & RVE) {
        /* when we support 'E' we can do "val = RVE;" however
         * for now we just drop writes if 'E' is present.
         */
        return 0;
    }

    /* Mask extensions that are not supported by this hart */
    val &= env->misa_mask;

    /* Mask extensions that are not supported by QEMU */
    val &= (RVI | RVE | RVM | RVA | RVF | RVD | RVC | RVS | RVU);

    /* 'D' depends on 'F', so clear 'D' if 'F' is not present */
    if ((val & RVD) && !(val & RVF)) {
        val &= ~RVD;
    }

    /* Suppress 'C' if next instruction is not aligned
     * TODO: this should check next_pc
     */
    if ((val & RVC) && (GETPC() & ~3) != 0) {
        val &= ~RVC;
    }

    /* misa.MXL writes are not supported by QEMU */
    val = (env->misa & MISA_MXL) | (val & ~MISA_MXL);

    /* flush translation cache */
    if (val != env->misa) {
        tb_flush(env_cpu(env));
    }

    env->misa = val;

    return 0;
}